

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUURI.cpp
# Opt level: O0

void __thiscall COLLADABU::URI::copyFrom(URI *this,URI *copyFrom)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  std::__cxx11::string::operator=(in_RDI + 0x20,in_RSI + 0x20);
  std::__cxx11::string::operator=(in_RDI + 0x40,in_RSI + 0x40);
  std::__cxx11::string::operator=(in_RDI + 0x60,in_RSI + 0x60);
  std::__cxx11::string::operator=(in_RDI + 0x80,in_RSI + 0x80);
  std::__cxx11::string::operator=(in_RDI + 0xa0,in_RSI + 0xa0);
  std::__cxx11::string::operator=(in_RDI + 0xc0,in_RSI + 0xc0);
  in_RDI[0xe0] = (string)((byte)in_RSI[0xe0] & 1);
  return;
}

Assistant:

void URI::copyFrom(const URI& copyFrom)
	{
//		set(copyFrom.originalStr());
		mUriString = copyFrom.mUriString;
		mOriginalURIString = copyFrom.mOriginalURIString;
		mScheme = copyFrom.mScheme;
		mAuthority = copyFrom.mAuthority;
		mPath = copyFrom.mPath;
		mQuery = copyFrom.mQuery;
		mFragment = copyFrom.mFragment;
		mIsValid = copyFrom.mIsValid;
	}